

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_Error FT_Stream_EnterFrame(FT_Stream stream,FT_ULong count)

{
  ulong uVar1;
  FT_Memory pFVar2;
  ulong uVar3;
  FT_Error FVar4;
  uchar *puVar5;
  unsigned_long uVar6;
  FT_Stream_IoFunc p_Var7;
  uchar *puVar8;
  
  uVar1 = stream->size;
  p_Var7 = stream->read;
  if (p_Var7 == (FT_Stream_IoFunc)0x0) {
    uVar3 = stream->pos;
    if (uVar1 - uVar3 < count || uVar1 <= uVar3) {
      return 0x55;
    }
    stream->cursor = stream->base + uVar3;
    stream->limit = stream->base + uVar3 + count;
    stream->pos = uVar3 + count;
    return 0;
  }
  if (uVar1 < count) {
    return 0x55;
  }
  pFVar2 = stream->memory;
  if ((long)count < 1) {
    FVar4 = 6;
    if (count != 0) goto LAB_00218122;
    puVar5 = (uchar *)0x0;
  }
  else {
    puVar5 = (uchar *)(*pFVar2->alloc)(pFVar2,count);
    if (puVar5 == (uchar *)0x0) {
      FVar4 = 0x40;
LAB_00218122:
      stream->base = (uchar *)0x0;
      return FVar4;
    }
    p_Var7 = stream->read;
  }
  stream->base = puVar5;
  uVar6 = (*p_Var7)(stream,stream->pos,puVar5,count);
  FVar4 = 0;
  puVar5 = stream->base;
  if (uVar6 < count) {
    if (puVar5 != (uchar *)0x0) {
      (*pFVar2->free)(pFVar2,puVar5);
    }
    stream->base = (uchar *)0x0;
    FVar4 = 0x55;
    puVar5 = (uchar *)0x0;
  }
  stream->cursor = puVar5;
  puVar8 = puVar5 + count;
  if (puVar5 == (uchar *)0x0) {
    puVar8 = (uchar *)0x0;
  }
  stream->limit = puVar8;
  stream->pos = stream->pos + uVar6;
  return FVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_EnterFrame( FT_Stream  stream,
                        FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    FT_TRACE7(( "FT_Stream_EnterFrame: %ld bytes\n", count ));

    /* check for nested frame access */
    FT_ASSERT( stream && stream->cursor == 0 );

    if ( stream->read )
    {
      /* allocate the frame in memory */
      FT_Memory  memory = stream->memory;


      /* simple sanity check */
      if ( count > stream->size )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " frame size (%lu) larger than stream size (%lu)\n",
                   count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

#ifdef FT_DEBUG_MEMORY
      /* assume `ft_debug_file_` and `ft_debug_lineno_` are already set */
      stream->base = (unsigned char*)ft_mem_qalloc( memory,
                                                    (FT_Long)count,
                                                    &error );
      if ( error )
        goto Exit;
#else
      if ( FT_QALLOC( stream->base, count ) )
        goto Exit;
#endif
      /* read it */
      read_bytes = stream->read( stream, stream->pos,
                                 stream->base, count );
      if ( read_bytes < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid read; expected %lu bytes, got %lu\n",
                   count, read_bytes ));

        FT_FREE( stream->base );
        error = FT_THROW( Invalid_Stream_Operation );
      }

      stream->cursor = stream->base;
      stream->limit  = FT_OFFSET( stream->cursor, count );
      stream->pos   += read_bytes;
    }
    else
    {
      /* check current and new position */
      if ( stream->pos >= stream->size        ||
           stream->size - stream->pos < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid i/o; pos = 0x%lx, count = %lu, size = 0x%lx\n",
                   stream->pos, count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

      /* set cursor */
      stream->cursor = stream->base + stream->pos;
      stream->limit  = stream->cursor + count;
      stream->pos   += count;
    }

  Exit:
    return error;
  }